

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_var_tests.cpp
# Opt level: O2

void __thiscall iu_FlagTest_x_iutest_x_Check_Test::Body(iu_FlagTest_x_iutest_x_Check_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  iuStreamMessage *this_00;
  char *val;
  Fixed *fixed;
  int *in_R9;
  RepeatCountSet *actual;
  type **in_stack_fffffffffffffde8;
  AssertionResult iutest_ar;
  iuCodeMessage local_1e8;
  string local_1b8;
  iuStreamMessage local_198;
  
  local_198.m_stream.super_iu_stringstream._0_4_ = 0;
  iutest::internal::CmpHelperEQ<int,int_volatile>
            (&iutest_ar,(internal *)0x122577,"g_result.setup_environment",(char *)&local_198,
             &g_result.setup_environment,in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_198.m_stream);
    iutest::detail::iuStreamMessage::operator<<(&local_198,(char (*) [2])0x12431d);
    this_00 = &iutest::AssertionHelper::Fixed::operator<<((Fixed *)&local_198,lasterror)->
               super_Message;
    iutest::detail::iuStreamMessage::operator<<(this_00,(char (*) [3])0x122606);
    val = strerror(lasterror);
    fixed = iutest::AssertionHelper::Fixed::operator<<((Fixed *)this_00,val);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/env_var_tests.cpp"
               ,0x44,iutest_ar.m_message._M_dataplus._M_p);
    local_1e8._44_4_ = 0xfffffffd;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,fixed);
  }
  else {
    std::__cxx11::string::~string((string *)&iutest_ar);
    iutest_ar.m_result = iutest::TestFlag::IsEnableFlag(2);
    paVar1 = &iutest_ar.m_message.field_2;
    iutest_ar.m_message._M_string_length = 0;
    iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
    iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
    if (!iutest_ar.m_result) {
      memset(&local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_198.m_stream);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                (&local_1b8,(internal *)&iutest_ar,
                 (AssertionResult *)"::iutest::IUTEST_FLAG(also_run_disabled_tests)","false","true",
                 (char *)in_R9);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/env_var_tests.cpp"
                 ,0x45,local_1b8._M_dataplus._M_p);
      local_1e8._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,(Fixed *)&local_198);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_1b8);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_198.m_stream);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    iutest_ar.m_result = iutest::TestFlag::IsEnableFlag(0x10);
    iutest_ar.m_message._M_string_length = 0;
    iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
    iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
    if (!iutest_ar.m_result) {
      memset(&local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_198.m_stream);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                (&local_1b8,(internal *)&iutest_ar,
                 (AssertionResult *)"::iutest::IUTEST_FLAG(break_on_failure)","false","true",
                 (char *)in_R9);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/env_var_tests.cpp"
                 ,0x46,local_1b8._M_dataplus._M_p);
      local_1e8._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,(Fixed *)&local_198);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_1b8);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_198.m_stream);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    iutest_ar.m_result = iutest::TestFlag::IsEnableFlag(0x40);
    iutest_ar.m_message._M_string_length = 0;
    iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
    iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
    if (!iutest_ar.m_result) {
      memset(&local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_198.m_stream);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                (&local_1b8,(internal *)&iutest_ar,
                 (AssertionResult *)"::iutest::IUTEST_FLAG(throw_on_failure)","false","true",
                 (char *)in_R9);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/env_var_tests.cpp"
                 ,0x47,local_1b8._M_dataplus._M_p);
      local_1e8._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,(Fixed *)&local_198);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_1b8);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_198.m_stream);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    iutest_ar.m_result = iutest::TestFlag::IsEnableFlag(1);
    iutest_ar.m_message._M_string_length = 0;
    iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
    iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
    if (!iutest_ar.m_result) {
      memset(&local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_198.m_stream);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                (&local_1b8,(internal *)&iutest_ar,
                 (AssertionResult *)"::iutest::IUTEST_FLAG(shuffle)","false","true",(char *)in_R9);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/env_var_tests.cpp"
                 ,0x48,local_1b8._M_dataplus._M_p);
      local_1e8._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,(Fixed *)&local_198);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_1b8);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_198.m_stream);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    bVar2 = iutest::TestFlag::IsEnableFlag(0x30000);
    iutest_ar.m_message._M_string_length = 0;
    iutest_ar.m_result = !bVar2;
    iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
    iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
    if (!iutest_ar.m_result) {
      memset(&local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_198.m_stream);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                (&local_1b8,(internal *)&iutest_ar,
                 (AssertionResult *)"::iutest::IUTEST_FLAG(catch_exceptions)","true","false",
                 (char *)in_R9);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/env_var_tests.cpp"
                 ,0x49,local_1b8._M_dataplus._M_p);
      local_1e8._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,(Fixed *)&local_198);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_1b8);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_198.m_stream);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    bVar2 = iutest::TestFlag::IsEnableFlag(0x1000);
    iutest_ar.m_message._M_string_length = 0;
    iutest_ar.m_result = !bVar2;
    iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
    iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
    if (!iutest_ar.m_result) {
      memset(&local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_198.m_stream);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                (&local_1b8,(internal *)&iutest_ar,
                 (AssertionResult *)"::iutest::IUTEST_FLAG(print_time)","true","false",(char *)in_R9
                );
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/env_var_tests.cpp"
                 ,0x4a,local_1b8._M_dataplus._M_p);
      local_1e8._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,(Fixed *)&local_198);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_1b8);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_198.m_stream);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    iutest::TestEnv::
    OptionString<&iutest::TestEnv::get_default_package_name,_&iutest::TestEnv::set_default_package_name>
    ::OptionString((OptionString<&iutest::TestEnv::get_default_package_name,_&iutest::TestEnv::set_default_package_name>
                    *)&local_198);
    actual = (RepeatCountSet *)&iutest_type_traits::enabler_t<void>::value;
    iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
              (&iutest_ar,(internal *)"\"env_var\"",
               "::iutest::TestEnv::default_package_name().c_str()","env_var",
               (char *)CONCAT44(local_198.m_stream.super_iu_stringstream._4_4_,
                                local_198.m_stream.super_iu_stringstream._0_4_),
               (char *)&iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffde8);
    std::__cxx11::string::~string((string *)&local_198);
    if (iutest_ar.m_result == false) {
      memset(&local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_198.m_stream);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/env_var_tests.cpp"
                 ,0x4c,iutest_ar.m_message._M_dataplus._M_p);
      local_1e8._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,(Fixed *)&local_198);
      std::__cxx11::string::~string((string *)&local_1e8);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_198.m_stream);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    iutest_ar.m_result = iutest::TestFlag::IsEnableFlag(0x2000);
    iutest_ar.m_message._M_string_length = 0;
    iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
    iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
    if (!iutest_ar.m_result) {
      memset(&local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_198.m_stream);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                (&local_1b8,(internal *)&iutest_ar,
                 (AssertionResult *)"::iutest::IUTEST_FLAG(file_location_style_msvc)","false","true"
                 ,(char *)actual);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/env_var_tests.cpp"
                 ,0x4d,local_1b8._M_dataplus._M_p);
      local_1e8._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,(Fixed *)&local_198);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_1b8);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_198.m_stream);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    iutest_ar.m_result = iutest::TestFlag::IsEnableFlag(0x80);
    iutest_ar.m_message._M_string_length = 0;
    iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
    iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
    if (!iutest_ar.m_result) {
      memset(&local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_198.m_stream);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                (&local_1b8,(internal *)&iutest_ar,
                 (AssertionResult *)"::iutest::IUTEST_FLAG(warning_into_error)","false","true",
                 (char *)actual);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/env_var_tests.cpp"
                 ,0x4e,local_1b8._M_dataplus._M_p);
      local_1e8._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,(Fixed *)&local_198);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_1b8);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_198.m_stream);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    local_198.m_stream.super_iu_stringstream._0_4_ = 200;
    iutest::internal::CmpHelperEQ<unsigned_int,iutest::TestEnv::RandomSeedSet>
              (&iutest_ar,(internal *)"200u","::iutest::TestEnv::random_seed()",(char *)&local_198,
               (uint *)&local_1e8,(RandomSeedSet *)actual);
    if (iutest_ar.m_result == false) {
      memset(&local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_198.m_stream);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/env_var_tests.cpp"
                 ,0x51,iutest_ar.m_message._M_dataplus._M_p);
      local_1e8._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,(Fixed *)&local_198);
      std::__cxx11::string::~string((string *)&local_1e8);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_198.m_stream);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    local_198.m_stream.super_iu_stringstream._0_4_ = 2;
    iutest::internal::CmpHelperEQ<int,iutest::TestEnv::RepeatCountSet>
              (&iutest_ar,(internal *)0x122179,"::iutest::TestEnv::repeat()",(char *)&local_198,
               (int *)&local_1e8,actual);
    if (iutest_ar.m_result == false) {
      memset(&local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_198.m_stream);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/env_var_tests.cpp"
                 ,0x52,iutest_ar.m_message._M_dataplus._M_p);
      local_1e8._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,(Fixed *)&local_198);
      std::__cxx11::string::~string((string *)&local_1e8);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_198.m_stream);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    iutest::TestEnv::OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>
    ::OptionString((OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter> *
                   )&local_198);
    iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
              (&iutest_ar,(internal *)"\"Flag*\"","::iutest::TestEnv::filter().c_str()","Flag*",
               (char *)CONCAT44(local_198.m_stream.super_iu_stringstream._4_4_,
                                local_198.m_stream.super_iu_stringstream._0_4_),
               (char *)&iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffde8);
    std::__cxx11::string::~string((string *)&local_198);
    if (iutest_ar.m_result == false) {
      memset(&local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_198.m_stream);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/env_var_tests.cpp"
                 ,0x54,iutest_ar.m_message._M_dataplus._M_p);
      local_1e8._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,(Fixed *)&local_198);
      std::__cxx11::string::~string((string *)&local_1e8);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_198.m_stream);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    iutest::TestEnv::
    OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>::
    OptionString((OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>
                  *)&local_198);
    iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
              (&iutest_ar,(internal *)"\"test\"","::iutest::TestEnv::output().c_str()","test",
               (char *)CONCAT44(local_198.m_stream.super_iu_stringstream._4_4_,
                                local_198.m_stream.super_iu_stringstream._0_4_),
               (char *)&iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffde8);
    std::__cxx11::string::~string((string *)&local_198);
    if (iutest_ar.m_result != false) goto LAB_00115391;
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_198.m_stream);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/env_var_tests.cpp"
               ,0x55,iutest_ar.m_message._M_dataplus._M_p);
    local_1e8._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,(Fixed *)&local_198);
  }
  std::__cxx11::string::~string((string *)&local_1e8);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_198.m_stream);
LAB_00115391:
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST(FlagTest, Check)
{
    IUTEST_ASSUME_EQ(0, g_result.setup_environment) << "\n" << lasterror << ": " << strerror(lasterror);  // putenv に失敗した場合はテストしない
    IUTEST_EXPECT_TRUE( ::iutest::IUTEST_FLAG(also_run_disabled_tests) );
    IUTEST_EXPECT_TRUE( ::iutest::IUTEST_FLAG(break_on_failure) );
    IUTEST_EXPECT_TRUE( ::iutest::IUTEST_FLAG(throw_on_failure) );
    IUTEST_EXPECT_TRUE( ::iutest::IUTEST_FLAG(shuffle) );
    IUTEST_EXPECT_FALSE( ::iutest::IUTEST_FLAG(catch_exceptions) );
    IUTEST_EXPECT_FALSE( ::iutest::IUTEST_FLAG(print_time) );
#if !defined(IUTEST_USE_GTEST)
    IUTEST_EXPECT_STREQ( "env_var", ::iutest::IUTEST_FLAG(default_package_name).c_str() );
    IUTEST_EXPECT_TRUE( ::iutest::IUTEST_FLAG(file_location_style_msvc) );
    IUTEST_EXPECT_TRUE( ::iutest::IUTEST_FLAG(warning_into_error) );
#endif

    IUTEST_EXPECT_EQ( 200u, ::iutest::IUTEST_FLAG(random_seed) );
    IUTEST_EXPECT_EQ(   2 , ::iutest::IUTEST_FLAG(repeat) );

    IUTEST_EXPECT_STREQ( "Flag*", ::iutest::IUTEST_FLAG(filter).c_str() );
    IUTEST_EXPECT_STREQ( "test", ::iutest::IUTEST_FLAG(output).c_str() );
}